

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::FindVCChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  uint uVar1;
  __type _Var2;
  bool bVar3;
  const_reference cVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint *puVar8;
  vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *this_00;
  reference puVar9;
  const_reference pvVar10;
  Logger *this_01;
  bool local_f1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d8;
  uint *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  aiColor4t<float> local_78;
  uint local_68;
  uint local_64;
  uint idx;
  uint n;
  Face *face;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  iterator it;
  uint a;
  VColorChannel *vc;
  uint i;
  uint next;
  uint *out_local;
  Layer *layer_local;
  SortedRep *sorted_local;
  Surface *surf_local;
  LWOImporter *this_local;
  
  vc._4_4_ = 0;
  vc._0_4_ = 0;
  _i = out;
  out_local = (uint *)layer;
  layer_local = (Layer *)sorted;
  sorted_local = (SortedRep *)surf;
  surf_local = (Surface *)this;
  do {
    uVar5 = (ulong)(uint)vc;
    sVar6 = std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::
            size((vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_> *)
                 (out_local + 0x18));
    if (sVar6 <= uVar5) {
      if (vc._4_4_ != 8) {
        _i[vc._4_4_] = 0xffffffff;
      }
      return;
    }
    pvVar7 = std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::
             operator[]((vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                         *)(out_local + 0x18),(ulong)(uint)vc);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &sorted_local[3].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,&(pvVar7->super_VMapEntry).name);
    if (_Var2) {
      it._M_current._4_4_ = 0;
      while( true ) {
        uVar1 = it._M_current._4_4_;
        it._M_current._0_4_ = 7;
        puVar8 = std::min<unsigned_int>((uint *)((long)&vc + 4),(uint *)&it);
        if (*puVar8 <= uVar1) break;
        _i[it._M_current._4_4_ + 1] = _i[it._M_current._4_4_];
        it._M_current._4_4_ = it._M_current._4_4_ + 1;
      }
      *_i = (uint)vc;
      vc._4_4_ = vc._4_4_ + 1;
    }
    else {
      local_50._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)layer_local);
      while( true ) {
        face = (Face *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)layer_local
                                 );
        bVar3 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&face);
        if (!bVar3) break;
        this_00 = (vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                  (out_local + 0x40);
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_50);
        _idx = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::operator[]
                         (this_00,(ulong)*puVar9);
        for (local_64 = 0; local_64 < (_idx->super_aiFace).mNumIndices; local_64 = local_64 + 1) {
          local_68 = (_idx->super_aiFace).mIndices[local_64];
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&(pvVar7->super_VMapEntry).abAssigned,(ulong)local_68);
          local_f1 = false;
          if (cVar4) {
            pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&(pvVar7->super_VMapEntry).rawData,0);
            uVar5 = (ulong)local_68;
            aiColor4t<float>::aiColor4t(&local_78,0.0,0.0,0.0,1.0);
            local_f1 = aiColor4t<float>::operator!=
                                 ((aiColor4t<float> *)(pvVar10 + uVar5 * 4),&local_78);
          }
          if (local_f1 != false) {
            if (vc._4_4_ < 8) {
              _i[vc._4_4_] = (uint)vc;
              vc._4_4_ = vc._4_4_ + 1;
            }
            else {
              this_01 = DefaultLogger::get();
              std::operator+(&local_b8,
                             "LWO: Maximum number of vertex color channels for this mesh reached. Skipping channel \'"
                             ,&(pvVar7->super_VMapEntry).name);
              std::operator+(&local_98,&local_b8,"\'");
              Logger::error(this_01,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
            }
            local_d8._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    layer_local);
            local_d0 = (uint *)__gnu_cxx::
                               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               ::operator-(&local_d8,1);
            local_50 = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_d0;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_50);
      }
    }
    vc._0_4_ = (uint)vc + 1;
  } while( true );
}

Assistant:

void LWOImporter::FindVCChannels(const LWO::Surface& surf, LWO::SortedRep& sorted, const LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_COLOR_SETS])
{
    unsigned int next = 0;

    // Check whether we have an vc entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mVColorChannels.size();++i)  {
        const LWO::VColorChannel& vc = layer.mVColorChannels[i];

        if (surf.mVCMap == vc.name) {
            // The vertex color map is explicitly requested by the surface so we need to take special care of it
            for (unsigned int a = 0; a < std::min(next,AI_MAX_NUMBER_OF_COLOR_SETS-1u); ++a) {
                out[a+1] = out[a];
            }
            out[0] = i;
            ++next;
        }
        else {

            for (LWO::SortedRep::iterator it = sorted.begin(); it != sorted.end(); ++it)    {
                const LWO::Face& face = layer.mFaces[*it];

                for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                    unsigned int idx = face.mIndices[n];

                    if (vc.abAssigned[idx] && ((aiColor4D*)&vc.rawData[0])[idx] != aiColor4D(0.0,0.0,0.0,1.0)) {
                        if (next >= AI_MAX_NUMBER_OF_COLOR_SETS) {

                            ASSIMP_LOG_ERROR("LWO: Maximum number of vertex color channels for "
                                "this mesh reached. Skipping channel \'" + vc.name + "\'");

                        }
                        else {
                            out[next++] = i;
                        }
                        it = sorted.end()-1;
                        break;
                    }
                }
            }
        }
    }
    if (next != AI_MAX_NUMBER_OF_COLOR_SETS) {
        out[next] = UINT_MAX;
    }
}